

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perror.c
# Opt level: O0

PErrorDomain p_error_get_domain(PError *error)

{
  PError *error_local;
  
  if (error == (PError *)0x0) {
    error_local._4_4_ = P_ERROR_DOMAIN_NONE;
  }
  else if (error->code < 600) {
    if (error->code < 500) {
      error_local._4_4_ = P_ERROR_DOMAIN_NONE;
    }
    else {
      error_local._4_4_ = P_ERROR_DOMAIN_IO;
    }
  }
  else {
    error_local._4_4_ = P_ERROR_DOMAIN_IPC;
  }
  return error_local._4_4_;
}

Assistant:

P_LIB_API PErrorDomain
p_error_get_domain (const PError *error)
{
	if (P_UNLIKELY (error == NULL))
		return P_ERROR_DOMAIN_NONE;

	if (error->code >= (pint) P_ERROR_DOMAIN_IPC)
		return P_ERROR_DOMAIN_IPC;
	else if (error->code >= (pint) P_ERROR_DOMAIN_IO)
		return P_ERROR_DOMAIN_IO;
	else
		return P_ERROR_DOMAIN_NONE;
}